

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t
exr_attr_string_vector_set_entry_with_length
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,int32_t idx,char *s,int32_t len)

{
  char *in_RCX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  int32_t in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  exr_attr_string_t *in_stack_ffffffffffffffb0;
  exr_context_t in_stack_ffffffffffffffb8;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))
                        (in_RDI,3,"Invalid reference to string vector object to assign to");
  }
  else if ((in_EDX < 0) || (*in_RSI <= in_EDX)) {
    if (in_RCX == (char *)0x0) {
      in_RCX = "<nil>";
    }
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,
                         "Invalid index (%d of %d) assigning string vector (\'%s\', len %d)",in_EDX,
                         *in_RSI,in_RCX);
  }
  else {
    local_4 = exr_attr_string_set_with_length
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_vector_set_entry_with_length (
    exr_context_t             ctxt,
    exr_attr_string_vector_t* sv,
    int32_t                   idx,
    const char*               s,
    int32_t                   len)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!sv)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    if (idx < 0 || idx >= sv->n_strings)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid index (%d of %d) assigning string vector ('%s', len %d)",
            idx,
            sv->n_strings,
            s ? s : "<nil>",
            len);

    return exr_attr_string_set_with_length (
        ctxt, EXR_CONST_CAST (exr_attr_string_t*, sv->strings + idx), s, len);
}